

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p12_decr.c
# Opt level: O0

ASN1_OCTET_STRING *
PKCS12_item_i2d_encrypt_ex
          (X509_ALGOR *algor,ASN1_ITEM *it,char *pass,int passlen,void *obj,int zbuf,
          OSSL_LIB_CTX *ctx,char *propq)

{
  int iVar1;
  ASN1_OCTET_STRING *a;
  uchar *puVar2;
  undefined4 in_ECX;
  X509_ALGOR *in_RDX;
  ASN1_ITEM *in_RSI;
  int *in_RDI;
  ASN1_VALUE *in_R8;
  int in_R9D;
  OSSL_LIB_CTX *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int inlen;
  uchar *in;
  ASN1_OCTET_STRING *oct;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  int iVar4;
  char *in_stack_ffffffffffffffa0;
  uchar **data;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_fffffffffffffff8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  data = (uchar **)0x0;
  a = ASN1_OCTET_STRING_new();
  if (a == (ASN1_OCTET_STRING *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffa0,iVar4,
                  (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    ERR_set_error(0x23,0xc0100,(char *)0x0);
  }
  else {
    iVar1 = ASN1_item_i2d(in_R8,(uchar **)&stack0xffffffffffffffb8,in_RSI);
    if (data == (uchar **)0x0) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffa0,iVar4,
                    (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      ERR_set_error(0x23,0x66,(char *)0x0);
    }
    else {
      uVar3 = 1;
      puVar2 = PKCS12_pbe_crypt_ex(in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                   (int)((ulong)in_R8 >> 0x20),
                                   (uchar *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                                   (int)((ulong)a >> 0x20),data,in_RDI,in_stack_fffffffffffffff8,
                                   unaff_retaddr,in_stack_00000008);
      iVar4 = (int)((ulong)in_stack_00000008 >> 0x20);
      if (puVar2 != (uchar *)0x0) {
        if (in_R9D != 0) {
          OPENSSL_cleanse(data,(long)iVar1);
        }
        CRYPTO_free(data);
        return (ASN1_OCTET_STRING *)a;
      }
      ERR_new();
      ERR_set_debug(in_stack_00000010,iVar4,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar3));
      ERR_set_error(0x23,0x67,(char *)0x0);
      CRYPTO_free(data);
    }
  }
  ASN1_OCTET_STRING_free(a);
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *PKCS12_item_i2d_encrypt_ex(X509_ALGOR *algor,
                                              const ASN1_ITEM *it,
                                              const char *pass, int passlen,
                                              void *obj, int zbuf,
                                              OSSL_LIB_CTX *ctx,
                                              const char *propq)
{
    ASN1_OCTET_STRING *oct = NULL;
    unsigned char *in = NULL;
    int inlen;

    if ((oct = ASN1_OCTET_STRING_new()) == NULL) {
        ERR_raise(ERR_LIB_PKCS12, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    inlen = ASN1_item_i2d(obj, &in, it);
    if (!in) {
        ERR_raise(ERR_LIB_PKCS12, PKCS12_R_ENCODE_ERROR);
        goto err;
    }
    if (!PKCS12_pbe_crypt_ex(algor, pass, passlen, in, inlen, &oct->data,
                             &oct->length, 1, ctx, propq)) {
        ERR_raise(ERR_LIB_PKCS12, PKCS12_R_ENCRYPT_ERROR);
        OPENSSL_free(in);
        goto err;
    }
    if (zbuf)
        OPENSSL_cleanse(in, inlen);
    OPENSSL_free(in);
    return oct;
 err:
    ASN1_OCTET_STRING_free(oct);
    return NULL;
}